

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O0

void idx2::Copy<float>(grid *SGrid,volume *SVol,volume *DVol)

{
  undefined1 local_e8 [8];
  grid_iterator<float> DIt;
  grid_iterator<float> SEnd;
  grid_iterator<float> SIt;
  volume *DVol_local;
  volume *SVol_local;
  grid *SGrid_local;
  
  Begin<float>((grid_iterator<float> *)((long)&SEnd.N.field_0.field_3.XY.field_0 + 4),SGrid,SVol);
  End<float>((grid_iterator<float> *)((long)&DIt.N.field_0.field_3.XY.field_0 + 4),SGrid,SVol);
  Begin<float>((grid_iterator<float> *)local_e8,SGrid,DVol);
  while( true ) {
    if (SEnd.N.field_0.field_4.YZ.field_0 == DIt.N.field_0.field_4.YZ.field_0) break;
    *(float *)local_e8 = *(float *)SEnd.N.field_0.field_4.YZ.field_0;
    grid_iterator<float>::operator++
              ((grid_iterator<float> *)((long)&SEnd.N.field_0.field_3.XY.field_0 + 4));
    grid_iterator<float>::operator++((grid_iterator<float> *)local_e8);
  }
  return;
}

Assistant:

void
Copy(const grid& SGrid, const volume& SVol, volume* DVol)
{
  idx2_Assert(Dims(SGrid) <= Dims(*DVol));
  idx2_Assert(Dims(SGrid) <= Dims(SVol));
  idx2_Assert(DVol->Buffer && SVol.Buffer);
  idx2_Assert(SVol.Type == DVol->Type);

  auto SIt = Begin<t>(SGrid, SVol), SEnd = End<t>(SGrid, SVol);
  auto DIt = Begin<t>(SGrid, *DVol);
  for (; SIt != SEnd; ++SIt, ++DIt)
    *DIt = *SIt;
}